

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.c
# Opt level: O2

void * handlecliThreadProc(void *pHandlecliThreadParam)

{
  int __fd;
  
  __fd = *(int *)((long)pHandlecliThreadParam + 8);
  (**pHandlecliThreadParam)(__fd,*(undefined8 *)((long)pHandlecliThreadParam + 0x10));
  free(pHandlecliThreadParam);
  shutdown(__fd,2);
  close(__fd);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE handlecliThreadProc(void* pHandlecliThreadParam)
{
	int (*handlecli)(SOCKET, void*) = ((HANDLECLITHREADPARAM*)pHandlecliThreadParam)->handlecli;
	SOCKET sockcli = ((HANDLECLITHREADPARAM*)pHandlecliThreadParam)->sockcli;
	void* pParam = ((HANDLECLITHREADPARAM*)pHandlecliThreadParam)->pParam;

	if (handlecli(sockcli, pParam) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_WARNING_OSNET(("handlecliThreadProc warning (%s) : %s\n", 
			strtime_m(), 
			"Error while communicating with a client. "));
	}

	free(pHandlecliThreadParam);
	if (disconnectclifromtcpsrv(sockcli) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_WARNING_OSNET(("handlecliThreadProc warning (%s) : %s\n", 
			strtime_m(), 
			"Error disconnecting a client. "));
	}

	return 0;
}